

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMakeLibTests.cxx
# Opt level: O3

char * lowercase(char *string)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  
  sVar4 = strlen(string);
  __dest = (char *)malloc(sVar4 + 1);
  if (__dest != (char *)0x0) {
    strcpy(__dest,string);
    cVar1 = *__dest;
    pcVar2 = __dest;
    while (cVar1 != '\0') {
      iVar3 = tolower((int)cVar1);
      *pcVar2 = (char)iVar3;
      cVar1 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    }
  }
  return __dest;
}

Assistant:

static char* lowercase(const char* string)
{
  char *new_string;
  char *p;
  size_t stringSize;

  stringSize = CM_CAST(size_t, strlen(string) + 1);
  new_string = CM_CAST(char*, malloc(sizeof(char) * stringSize));

  if (new_string == CM_NULL) { /* NOLINT */
    return CM_NULL;            /* NOLINT */
  }
  strcpy(new_string, string);  /* NOLINT */
  for (p = new_string; *p != 0; ++p) {
    *p = CM_CAST(char, tolower(*p));
  }
  return new_string;
}